

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestInfo * __thiscall testing::UnitTest::current_test_info(UnitTest *this)

{
  TestInfo *pTVar1;
  GTestMutexLock *in_RDI;
  MutexLock lock;
  MutexBase *in_stack_ffffffffffffffc8;
  
  internal::GTestMutexLock::GTestMutexLock(in_RDI,in_stack_ffffffffffffffc8);
  pTVar1 = internal::UnitTestImpl::current_test_info((UnitTestImpl *)in_RDI[7].mutex_);
  internal::GTestMutexLock::~GTestMutexLock((GTestMutexLock *)0x158890);
  return pTVar1;
}

Assistant:

const TestInfo* UnitTest::current_test_info() const {
  internal::MutexLock lock(&mutex_);
  return impl_->current_test_info();
}